

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O2

void __thiscall CTcSrcFile::~CTcSrcFile(CTcSrcFile *this)

{
  (this->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0030df30;
  if (this->fp_ != (CVmDataSource *)0x0) {
    (*this->fp_->_vptr_CVmDataSource[1])();
  }
  if (&this->mapper_->super_CCharmap != (CCharmap *)0x0) {
    CCharmap::release_ref(&this->mapper_->super_CCharmap);
    return;
  }
  return;
}

Assistant:

CTcSrcFile::~CTcSrcFile()
{
    /* close my source file */
    if (fp_ != 0)
        delete fp_;

    /* release my character mapper */
    if (mapper_ != 0)
        mapper_->release_ref();
}